

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlsafe_b64.c
# Opt level: O0

size_t urlsafe_b64_encode_(uchar *src,size_t srcSize,b64_char_t *dest,size_t destLen,uint lineLen,
                          B64_RC *rc)

{
  ulong uVar1;
  char *pcVar2;
  b64_char_t *pbVar3;
  long local_80;
  b64_char_t *local_78;
  size_t i;
  uchar dummy [3];
  ulong uStack_68;
  b64_char_t characters [4];
  size_t len;
  b64_char_t *end;
  b64_char_t *p;
  size_t numLines;
  size_t total;
  B64_RC *rc_local;
  uint lineLen_local;
  size_t destLen_local;
  b64_char_t *dest_local;
  size_t srcSize_local;
  uchar *src_local;
  
  numLines = ((srcSize + 2) / 3) * 4;
  if (rc == (B64_RC *)0x0) {
    __assert_fail("(((void*)0) != rc)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                  ,0x84,
                  "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                 );
  }
  *rc = B64_RC_OK;
  if (lineLen != 0) {
    uVar1 = (numLines + (lineLen - 1)) / (ulong)lineLen;
    if (uVar1 == 0) {
      local_80 = 0;
    }
    else {
      local_80 = uVar1 - 1;
    }
    numLines = local_80 * 2 + numLines;
  }
  if (dest == (b64_char_t *)0x0) {
    src_local = (uchar *)numLines;
  }
  else if (destLen < numLines) {
    *rc = B64_RC_INSUFFICIENT_BUFFER;
    src_local = (uchar *)0x0;
  }
  else {
    uStack_68 = 0;
    end = dest;
    srcSize_local = (size_t)src;
    for (dest_local = (b64_char_t *)srcSize; (b64_char_t *)0x2 < dest_local;
        dest_local = dest_local + -3) {
      i._4_1_ = (byte)((int)(*(byte *)srcSize_local & 0xfc) >> 2);
      i._5_1_ = (*(byte *)srcSize_local & 3) * '\x10' +
                (char)((int)(*(byte *)(srcSize_local + 1) & 0xf0) >> 4);
      i._6_1_ = (*(byte *)(srcSize_local + 1) & 0xf) * '\x04' +
                (char)((int)(*(byte *)(srcSize_local + 2) & 0xc0) >> 6);
      i._7_1_ = *(byte *)(srcSize_local + 2) & 0x3f;
      if (0x3f < i._4_1_) {
        __assert_fail("(characters[0] >= 0 && characters[0] < 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,0xb9,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      if (0x3f < i._5_1_) {
        __assert_fail("(characters[1] >= 0 && characters[1] < 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,0xba,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      if (0x3f < i._6_1_) {
        __assert_fail("(characters[2] >= 0 && characters[2] < 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,0xbb,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      if (0x3f < i._7_1_) {
        __assert_fail("(characters[3] >= 0 && characters[3] < 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,0xbc,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      srcSize_local = srcSize_local + 3;
      *end = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[i._4_1_];
      pcVar2 = strchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",(int)*end);
      if (pcVar2 == (char *)0x0) {
        __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,0xc1,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      uStack_68 = uStack_68 + 1;
      if (uStack_68 == lineLen) {
        __assert_fail("(len != lineLen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,0xc3,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      end[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[i._5_1_];
      pcVar2 = strchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",(int)end[1]
                     );
      if (pcVar2 == (char *)0x0) {
        __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,0xc6,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      uStack_68 = uStack_68 + 1;
      if (uStack_68 == lineLen) {
        __assert_fail("(len != lineLen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,200,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      end[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[i._6_1_];
      pcVar2 = strchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",(int)end[2]
                     );
      if (pcVar2 == (char *)0x0) {
        __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,0xcb,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      uStack_68 = uStack_68 + 1;
      if (uStack_68 == lineLen) {
        __assert_fail("(len != lineLen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,0xcd,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      pbVar3 = end + 4;
      end[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[i._7_1_];
      pcVar2 = strchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_",(int)end[3]
                     );
      if (pcVar2 == (char *)0x0) {
        __assert_fail("(((void*)0) != strchr(b64_chars, *(p-1)))",
                      "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/b64/urlsafe_b64.c"
                      ,0xd0,
                      "size_t urlsafe_b64_encode_(const unsigned char *, size_t, b64_char_t *const, size_t, unsigned int, B64_RC *)"
                     );
      }
      uStack_68 = uStack_68 + 1;
      if ((uStack_68 == lineLen) && (pbVar3 != dest + destLen)) {
        *pbVar3 = '\r';
        end[5] = '\n';
        uStack_68 = 0;
        pbVar3 = end + 6;
      }
      end = pbVar3;
    }
    if (dest_local != (b64_char_t *)0x0) {
      for (local_78 = (b64_char_t *)0x0; local_78 != dest_local; local_78 = local_78 + 1) {
        local_78[(long)&i + 1] = *(b64_char_t *)srcSize_local;
        srcSize_local = srcSize_local + 1;
      }
      for (; local_78 != (b64_char_t *)0x3; local_78 = local_78 + 1) {
        local_78[(long)&i + 1] = '\0';
      }
      urlsafe_b64_encode_((uchar *)((long)&i + 1),3,end,0xc,0,rc);
      end = dest_local + 1 + (long)end;
      while (dest_local != (b64_char_t *)0x3) {
        *end = '=';
        end = end + 1;
        dest_local = dest_local + 1;
      }
    }
    src_local = (uchar *)numLines;
  }
  return (size_t)src_local;
}

Assistant:

size_t urlsafe_b64_encode_(
    unsigned char const*    src
,   size_t                  srcSize
,   b64_char_t* const       dest
,   size_t                  destLen
,   unsigned                lineLen
,   B64_RC*                 rc
)
{
	static const b64_char_t b64_chars[] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_";
    size_t total = ((srcSize + (NUM_PLAIN_DATA_BYTES - 1)) / NUM_PLAIN_DATA_BYTES) * NUM_ENCODED_DATA_BYTES;

    B64_ENFORCE_PRECONDITION(NULL != rc, "pointer to return code may not be NULL");
    *rc = B64_RC_OK;

    if(lineLen > 0)
    {
        size_t numLines = (total + (lineLen - 1)) / lineLen;

        total += 2 * (0 == numLines ? 0u : (numLines - 1));
    }

    if(NULL == dest)
    {
        return total;
    }
    else if(destLen < total)
    {
        *rc = B64_RC_INSUFFICIENT_BUFFER;

        return 0;
    }
    else
    {
        b64_char_t* p   =   dest;
        b64_char_t* end =   dest + destLen;
        size_t      len =   0;

        for(; NUM_PLAIN_DATA_BYTES <= srcSize; srcSize -= NUM_PLAIN_DATA_BYTES)
        {
            b64_char_t characters[NUM_ENCODED_DATA_BYTES];

            /* 
             * 
             * |       0       |       1       |       2       |
             *
             * |               |               |               |
             * |       |       |       |       |       |       |
             * |   |   |   |   |   |   |   |   |   |   |   |   |
             * | | | | | | | | | | | | | | | | | | | | | | | | |
             * 
             * |     0     |     1     |     2     |     3     |
             * 
             */

            /* characters[0] is the 6 left-most bits of src[0] */
            characters[0] = (b64_char_t)((src[0] & 0xfc) >> 2);
            /* characters[0] is the right-most 2 bits of src[0] and the left-most 4 bits of src[1] */
            characters[1] = (b64_char_t)(((src[0] & 0x03) << 4) + ((src[1] & 0xf0) >> 4));
            /* characters[0] is the right-most 4 bits of src[1] and the 2 left-most bits of src[2] */
            characters[2] = (b64_char_t)(((src[1] & 0x0f) << 2) + ((src[2] & 0xc0) >> 6));
            /* characters[3] is the right-most 6 bits of src[2] */
            characters[3] = (b64_char_t)(src[2] & 0x3f);

#ifndef __WATCOMC__
            B64_ENFORCE_ASSUMPTION(characters[0] >= 0 && characters[0] < 64);
            B64_ENFORCE_ASSUMPTION(characters[1] >= 0 && characters[1] < 64);
            B64_ENFORCE_ASSUMPTION(characters[2] >= 0 && characters[2] < 64);
            B64_ENFORCE_ASSUMPTION(characters[3] >= 0 && characters[3] < 64);
#endif /* __WATCOMC__ */

            src += NUM_PLAIN_DATA_BYTES;
            *p++ = b64_chars[(unsigned char)characters[0]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));
            ++len;
            B64_ENFORCE_ASSUMPTION(len != lineLen);

            *p++ = b64_chars[(unsigned char)characters[1]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));
            ++len;
            B64_ENFORCE_ASSUMPTION(len != lineLen);

            *p++ = b64_chars[(unsigned char)characters[2]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));
            ++len;
            B64_ENFORCE_ASSUMPTION(len != lineLen);

            *p++ = b64_chars[(unsigned char)characters[3]];
            B64_ENFORCE_ASSUMPTION(NULL != b64_strchr_(b64_chars, *(p-1)));

            if( ++len == lineLen &&
                p != end)
            {
                *p++ = '\r';
                *p++ = '\n';
                len = 0;
            }
        }

        if(0 != srcSize)
        {
            /* Deal with the overspill, by boosting it up to three bytes (using 0s)
             * and then appending '=' for any missing characters.
             *
             * This is done into a temporary buffer, so we can call ourselves and
             * have the output continue to be written direct to the destination.
             */

            unsigned char   dummy[NUM_PLAIN_DATA_BYTES];
            size_t          i;

            for(i = 0; i != srcSize; ++i)
            {
                dummy[i] = *src++;
            }

            for(; i != NUM_PLAIN_DATA_BYTES; ++i)
            {
                dummy[i] = '\0';
            }

            urlsafe_b64_encode_(&dummy[0], NUM_PLAIN_DATA_BYTES, p, NUM_ENCODED_DATA_BYTES * (1 + 2), 0, rc);

            for(p += 1 + srcSize; srcSize++ != NUM_PLAIN_DATA_BYTES; )
            {
                *p++ = '=';
            }
        }

        return total;
    }
}